

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_weather(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  long in_RDI;
  char buf2 [4608];
  char buf [4608];
  char acStackY_2418 [16];
  CHAR_DATA *in_stack_ffffffffffffdbf8;
  char *in_stack_ffffffffffffdc00;
  char local_1218 [4624];
  long local_8;
  
  local_8 = in_RDI;
  bVar1 = is_outside(in_stack_ffffffffffffdbf8);
  if (bVar1) {
    sprintf(local_1218,"%s and the %s air %s\n\r",
            sky_look[*(short *)(*(long *)(*(long *)(local_8 + 0xa8) + 0x30) + 0x15a)],
            temp_look[*(short *)(*(long *)(*(long *)(local_8 + 0xa8) + 0x30) + 0x15c)],
            wind_look[*(short *)(*(long *)(*(long *)(local_8 + 0xa8) + 0x30) + 0x15e)]);
    send_to_char(in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
    if (sun != 2) {
      if ((*(short *)(*(long *)(*(long *)(local_8 + 0xa8) + 0x30) + 0x15a) == 2) ||
         (3 < *(short *)(*(long *)(*(long *)(local_8 + 0xa8) + 0x30) + 0x15a))) {
        send_to_char(in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
      }
      else {
        sprintf(acStackY_2418,"Berus is %s and Calabren is %s.\n\r",moon_look[moon_berus],
                moon_look[moon_calabren]);
        send_to_char(in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
      }
    }
  }
  else {
    sprintf(local_1218,"You can\'t see the sky from here, but the air around you is %s.\n\r",
            temp_look[*(short *)(*(long *)(*(long *)(local_8 + 0xa8) + 0x30) + 0x15c)]);
    send_to_char(in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  }
  return;
}

Assistant:

void do_weather(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH], buf2[MAX_STRING_LENGTH];

	if (!is_outside(ch))
	{
		sprintf(buf, "You can't see the sky from here, but the air around you is %s.\n\r", temp_look[ch->in_room->area->temp]);
		send_to_char(buf, ch);
		return;
	}

	sprintf(buf, "%s and the %s air %s\n\r",
		sky_look[ch->in_room->area->sky],
		temp_look[ch->in_room->area->temp],
		wind_look[ch->in_room->area->wind]);
	send_to_char(buf, ch);

	if (sun != SolarPosition::Daylight)
	{
		if (ch->in_room->area->sky == WeatherCondition::Overcast || ch->in_room->area->sky >= WeatherCondition::Downpour)
		{
			send_to_char("You cannot make out the twin moons through the thick cloud cover.\n\r", ch);
			return;
		}

		sprintf(buf2, "Berus is %s and Calabren is %s.\n\r", moon_look[moon_berus], moon_look[moon_calabren]);
		send_to_char(buf2, ch);
	}
}